

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_mapper.cpp
# Opt level: O2

string * __thiscall
spvtools::FriendlyNameMapper::Sanitize
          (string *__return_storage_ptr__,FriendlyNameMapper *this,string *suggested_name)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  allocator<char> local_51;
  string valid;
  
  if (suggested_name->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"_",(allocator<char> *)&valid);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&valid,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ_0123456789",
               &local_51);
    pcVar1 = (suggested_name->_M_dataplus)._M_p;
    sVar2 = suggested_name->_M_string_length;
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      std::__cxx11::string::find((char)&valid,(ulong)(uint)(int)pcVar1[sVar3]);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FriendlyNameMapper::Sanitize(const std::string& suggested_name) {
  if (suggested_name.empty()) return "_";
  // Otherwise, replace invalid characters by '_'.
  std::string result;
  std::string valid =
      "abcdefghijklmnopqrstuvwxyz"
      "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
      "_0123456789";
  std::transform(suggested_name.begin(), suggested_name.end(),
                 std::back_inserter(result), [&valid](const char c) {
                   return (std::string::npos == valid.find(c)) ? '_' : c;
                 });
  return result;
}